

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
array<CGlyphIndex,_allocator_default<CGlyphIndex>_>::alloc
          (array<CGlyphIndex,_allocator_default<CGlyphIndex>_> *this,int new_len)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  CGlyphIndex *pCVar3;
  undefined8 uVar4;
  CGlyphIndex *pCVar5;
  long lVar6;
  ulong uVar7;
  
  this->list_size = new_len;
  uVar7 = 0xffffffffffffffff;
  if (-1 < new_len) {
    uVar7 = (ulong)(uint)new_len << 4;
  }
  pCVar5 = (CGlyphIndex *)operator_new__(uVar7);
  if (this->num_elements < new_len) {
    new_len = this->num_elements;
  }
  pCVar3 = this->list;
  if (new_len < 1) {
    if (pCVar3 == (CGlyphIndex *)0x0) goto LAB_00132e81;
  }
  else {
    lVar6 = 0;
    do {
      puVar1 = (undefined8 *)((long)&pCVar3->m_FontSizeIndex + lVar6);
      uVar4 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pCVar5->m_FontSizeIndex + lVar6);
      *puVar2 = *puVar1;
      puVar2[1] = uVar4;
      lVar6 = lVar6 + 0x10;
    } while ((ulong)(uint)new_len << 4 != lVar6);
  }
  operator_delete__(pCVar3);
  new_len = this->list_size;
  if (this->num_elements < this->list_size) {
    new_len = this->num_elements;
  }
LAB_00132e81:
  this->num_elements = new_len;
  this->list = pCVar5;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}